

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

bool __thiscall HEkkDual::bailoutOnDualObjective(HEkkDual *this)

{
  double *pdVar1;
  double dVar2;
  HEkk *pHVar3;
  bool bVar4;
  
  pHVar3 = this->ekk_instance_;
  if ((((pHVar3->solve_bailout_ == false) && ((pHVar3->lp_).sense_ == kMinimize)) &&
      (this->solve_phase == 2)) &&
     (dVar2 = (pHVar3->info_).updated_dual_objective_value,
     pdVar1 = &(pHVar3->options_->super_HighsOptionsStruct).objective_bound,
     *pdVar1 <= dVar2 && dVar2 != *pdVar1)) {
    bVar4 = reachedExactObjectiveBound(this);
    this->ekk_instance_->solve_bailout_ = bVar4;
  }
  return this->ekk_instance_->solve_bailout_;
}

Assistant:

bool HEkkDual::bailoutOnDualObjective() {
  if (ekk_instance_.solve_bailout_) {
    // Bailout has already been decided: check that it's for one of these
    // reasons
    assert(ekk_instance_.model_status_ == HighsModelStatus::kTimeLimit ||
           ekk_instance_.model_status_ == HighsModelStatus::kIterationLimit ||
           ekk_instance_.model_status_ == HighsModelStatus::kObjectiveBound);
  } else if (ekk_instance_.lp_.sense_ == ObjSense::kMinimize &&
             solve_phase == kSolvePhase2) {
    if (ekk_instance_.info_.updated_dual_objective_value >
        ekk_instance_.options_->objective_bound)
      ekk_instance_.solve_bailout_ = reachedExactObjectiveBound();
  }
  return ekk_instance_.solve_bailout_;
}